

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* spirv_cross::CompilerMSL::get_illegal_func_names_abi_cxx11_(void)

{
  int iVar1;
  long lVar2;
  undefined1 local_10c4;
  undefined1 local_10c3;
  undefined1 local_10c2;
  allocator local_10c1;
  allocator local_10c0;
  allocator local_10bf;
  allocator local_10be;
  allocator local_10bd;
  allocator local_10bc;
  allocator local_10bb;
  allocator local_10ba;
  allocator local_10b9;
  allocator local_10b8;
  allocator local_10b7;
  allocator local_10b6;
  allocator local_10b5;
  allocator local_10b4;
  allocator local_10b3;
  allocator local_10b2;
  allocator local_10b1;
  allocator local_10b0;
  allocator local_10af;
  allocator local_10ae;
  allocator local_10ad;
  allocator local_10ac;
  allocator local_10ab;
  allocator local_10aa;
  allocator local_10a9;
  allocator local_10a8;
  allocator local_10a7;
  allocator local_10a6;
  allocator local_10a5;
  allocator local_10a4;
  allocator local_10a3;
  allocator local_10a2;
  allocator local_10a1;
  allocator local_10a0;
  allocator local_109f;
  allocator local_109e;
  allocator local_109d;
  allocator local_109c;
  allocator local_109b;
  allocator local_109a;
  allocator local_1099;
  allocator local_1098;
  allocator local_1097;
  allocator local_1096;
  allocator local_1095;
  allocator local_1094;
  allocator local_1093;
  allocator local_1092;
  allocator local_1091;
  allocator local_1090;
  allocator local_108f;
  allocator local_108e;
  allocator local_108d;
  allocator local_108c;
  allocator local_108b;
  allocator local_108a;
  allocator local_1089;
  allocator local_1088;
  allocator local_1087;
  allocator local_1086;
  allocator local_1085;
  allocator local_1084;
  allocator local_1083;
  allocator local_1082;
  allocator local_1081;
  allocator local_1080;
  allocator local_107f;
  allocator local_107e;
  allocator local_107d;
  allocator local_107c;
  allocator local_107b;
  allocator local_107a;
  allocator local_1079;
  allocator local_1078;
  allocator local_1077;
  allocator local_1076;
  allocator local_1075;
  allocator local_1074;
  allocator local_1073;
  allocator local_1072;
  allocator local_1071;
  allocator local_1070;
  allocator local_106f;
  allocator local_106e;
  allocator local_106d;
  allocator local_106c;
  allocator local_106b;
  allocator local_106a;
  allocator local_1069;
  allocator local_1068;
  allocator local_1067;
  allocator local_1066;
  allocator local_1065;
  allocator local_1064;
  allocator local_1063;
  allocator local_1062;
  allocator local_1061;
  allocator local_1060;
  allocator local_105f;
  allocator local_105e;
  allocator local_105d;
  allocator local_105c;
  allocator local_105b;
  allocator local_105a;
  allocator local_1059;
  allocator local_1058;
  allocator local_1057;
  allocator local_1056;
  allocator local_1055;
  allocator local_1054;
  allocator local_1053;
  allocator local_1052;
  allocator local_1051;
  allocator local_1050;
  allocator local_104f;
  allocator local_104e;
  allocator local_104d;
  allocator local_104c;
  allocator local_104b;
  allocator local_104a;
  allocator local_1049;
  allocator local_1048;
  allocator local_1047;
  allocator local_1046;
  allocator local_1045;
  allocator local_1044;
  allocator local_1043;
  allocator local_1042;
  allocator local_1041;
  string local_1040 [32];
  string local_1020 [32];
  string local_1000 [32];
  string local_fe0 [32];
  string local_fc0 [32];
  string local_fa0 [32];
  string local_f80 [32];
  string local_f60 [32];
  string local_f40 [32];
  string local_f20 [32];
  string local_f00 [32];
  string local_ee0 [32];
  string local_ec0 [32];
  string local_ea0 [32];
  string local_e80 [32];
  string local_e60 [32];
  string local_e40 [32];
  string local_e20 [32];
  string local_e00 [32];
  string local_de0 [32];
  string local_dc0 [32];
  string local_da0 [32];
  string local_d80 [32];
  string local_d60 [32];
  string local_d40 [32];
  string local_d20 [32];
  string local_d00 [32];
  string local_ce0 [32];
  string local_cc0 [32];
  string local_ca0 [32];
  string local_c80 [32];
  string local_c60 [32];
  string local_c40 [32];
  string local_c20 [32];
  string local_c00 [32];
  string local_be0 [32];
  string local_bc0 [32];
  string local_ba0 [32];
  string local_b80 [32];
  string local_b60 [32];
  string local_b40 [32];
  string local_b20 [32];
  string local_b00 [32];
  string local_ae0 [32];
  string local_ac0 [32];
  string local_aa0 [32];
  string local_a80 [32];
  string local_a60 [32];
  string local_a40 [32];
  string local_a20 [32];
  string local_a00 [32];
  string local_9e0 [32];
  string local_9c0 [32];
  string local_9a0 [32];
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  if (get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_)
    ;
    if (iVar1 != 0) {
      ::std::__cxx11::string::string(local_1040,"main",&local_1041);
      ::std::__cxx11::string::string(local_1020,"fragment",&local_1042);
      ::std::__cxx11::string::string(local_1000,"vertex",&local_1043);
      ::std::__cxx11::string::string(local_fe0,"kernel",&local_1044);
      ::std::__cxx11::string::string(local_fc0,"saturate",&local_1045);
      ::std::__cxx11::string::string(local_fa0,"assert",&local_1046);
      ::std::__cxx11::string::string(local_f80,"fmin3",&local_1047);
      ::std::__cxx11::string::string(local_f60,"fmax3",&local_1048);
      ::std::__cxx11::string::string(local_f40,"divide",&local_1049);
      ::std::__cxx11::string::string(local_f20,"fmod",&local_104a);
      ::std::__cxx11::string::string(local_f00,"median3",&local_104b);
      ::std::__cxx11::string::string(local_ee0,"VARIABLE_TRACEPOINT",&local_104c);
      ::std::__cxx11::string::string(local_ec0,"STATIC_DATA_TRACEPOINT",&local_104d);
      ::std::__cxx11::string::string(local_ea0,"STATIC_DATA_TRACEPOINT_V",&local_104e);
      ::std::__cxx11::string::string(local_e80,"METAL_ALIGN",&local_104f);
      ::std::__cxx11::string::string(local_e60,"METAL_ASM",&local_1050);
      ::std::__cxx11::string::string(local_e40,"METAL_CONST",&local_1051);
      ::std::__cxx11::string::string(local_e20,"METAL_DEPRECATED",&local_1052);
      ::std::__cxx11::string::string(local_e00,"METAL_ENABLE_IF",&local_1053);
      ::std::__cxx11::string::string(local_de0,"METAL_FUNC",&local_1054);
      ::std::__cxx11::string::string(local_dc0,"METAL_INTERNAL",&local_1055);
      ::std::__cxx11::string::string(local_da0,"METAL_NON_NULL_RETURN",&local_1056);
      ::std::__cxx11::string::string(local_d80,"METAL_NORETURN",&local_1057);
      ::std::__cxx11::string::string(local_d60,"METAL_NOTHROW",&local_1058);
      ::std::__cxx11::string::string(local_d40,"METAL_PURE",&local_1059);
      ::std::__cxx11::string::string(local_d20,"METAL_UNAVAILABLE",&local_105a);
      ::std::__cxx11::string::string(local_d00,"METAL_IMPLICIT",&local_105b);
      ::std::__cxx11::string::string(local_ce0,"METAL_EXPLICIT",&local_105c);
      ::std::__cxx11::string::string(local_cc0,"METAL_CONST_ARG",&local_105d);
      ::std::__cxx11::string::string(local_ca0,"METAL_ARG_UNIFORM",&local_105e);
      ::std::__cxx11::string::string(local_c80,"METAL_ZERO_ARG",&local_105f);
      ::std::__cxx11::string::string(local_c60,"METAL_VALID_LOD_ARG",&local_1060);
      ::std::__cxx11::string::string(local_c40,"METAL_VALID_LEVEL_ARG",&local_1061);
      ::std::__cxx11::string::string(local_c20,"METAL_VALID_STORE_ORDER",&local_1062);
      ::std::__cxx11::string::string(local_c00,"METAL_VALID_LOAD_ORDER",&local_1063);
      ::std::__cxx11::string::string
                (local_be0,"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",&local_1064);
      ::std::__cxx11::string::string
                (local_bc0,"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",&local_1065);
      ::std::__cxx11::string::string(local_ba0,"METAL_VALID_RENDER_TARGET",&local_1066);
      ::std::__cxx11::string::string(local_b80,"is_function_constant_defined",&local_1067);
      ::std::__cxx11::string::string(local_b60,"CHAR_BIT",&local_1068);
      ::std::__cxx11::string::string(local_b40,"SCHAR_MAX",&local_1069);
      ::std::__cxx11::string::string(local_b20,"SCHAR_MIN",&local_106a);
      ::std::__cxx11::string::string(local_b00,"UCHAR_MAX",&local_106b);
      ::std::__cxx11::string::string(local_ae0,"CHAR_MAX",&local_106c);
      ::std::__cxx11::string::string(local_ac0,"CHAR_MIN",&local_106d);
      ::std::__cxx11::string::string(local_aa0,"USHRT_MAX",&local_106e);
      ::std::__cxx11::string::string(local_a80,"SHRT_MAX",&local_106f);
      ::std::__cxx11::string::string(local_a60,"SHRT_MIN",&local_1070);
      ::std::__cxx11::string::string(local_a40,"UINT_MAX",&local_1071);
      ::std::__cxx11::string::string(local_a20,"INT_MAX",&local_1072);
      ::std::__cxx11::string::string(local_a00,"INT_MIN",&local_1073);
      ::std::__cxx11::string::string(local_9e0,"FLT_DIG",&local_1074);
      ::std::__cxx11::string::string(local_9c0,"FLT_MANT_DIG",&local_1075);
      ::std::__cxx11::string::string(local_9a0,"FLT_MAX_10_EXP",&local_1076);
      ::std::__cxx11::string::string(local_980,"FLT_MAX_EXP",&local_1077);
      ::std::__cxx11::string::string(local_960,"FLT_MIN_10_EXP",&local_1078);
      ::std::__cxx11::string::string(local_940,"FLT_MIN_EXP",&local_1079);
      ::std::__cxx11::string::string(local_920,"FLT_RADIX",&local_107a);
      ::std::__cxx11::string::string(local_900,"FLT_MAX",&local_107b);
      ::std::__cxx11::string::string(local_8e0,"FLT_MIN",&local_107c);
      ::std::__cxx11::string::string(local_8c0,"FLT_EPSILON",&local_107d);
      ::std::__cxx11::string::string(local_8a0,"FP_ILOGB0",&local_107e);
      ::std::__cxx11::string::string(local_880,"FP_ILOGBNAN",&local_107f);
      ::std::__cxx11::string::string(local_860,"MAXFLOAT",&local_1080);
      ::std::__cxx11::string::string(local_840,"HUGE_VALF",&local_1081);
      ::std::__cxx11::string::string(local_820,"INFINITY",&local_1082);
      ::std::__cxx11::string::string(local_800,"NAN",&local_1083);
      ::std::__cxx11::string::string(local_7e0,"M_E_F",&local_1084);
      ::std::__cxx11::string::string(local_7c0,"M_LOG2E_F",&local_1085);
      ::std::__cxx11::string::string(local_7a0,"M_LOG10E_F",&local_1086);
      ::std::__cxx11::string::string(local_780,"M_LN2_F",&local_1087);
      ::std::__cxx11::string::string(local_760,"M_LN10_F",&local_1088);
      ::std::__cxx11::string::string(local_740,"M_PI_F",&local_1089);
      ::std::__cxx11::string::string(local_720,"M_PI_2_F",&local_108a);
      ::std::__cxx11::string::string(local_700,"M_PI_4_F",&local_108b);
      ::std::__cxx11::string::string(local_6e0,"M_1_PI_F",&local_108c);
      ::std::__cxx11::string::string(local_6c0,"M_2_PI_F",&local_108d);
      ::std::__cxx11::string::string(local_6a0,"M_2_SQRTPI_F",&local_108e);
      ::std::__cxx11::string::string(local_680,"M_SQRT2_F",&local_108f);
      ::std::__cxx11::string::string(local_660,"M_SQRT1_2_F",&local_1090);
      ::std::__cxx11::string::string(local_640,"HALF_DIG",&local_1091);
      ::std::__cxx11::string::string(local_620,"HALF_MANT_DIG",&local_1092);
      ::std::__cxx11::string::string(local_600,"HALF_MAX_10_EXP",&local_1093);
      ::std::__cxx11::string::string(local_5e0,"HALF_MAX_EXP",&local_1094);
      ::std::__cxx11::string::string(local_5c0,"HALF_MIN_10_EXP",&local_1095);
      ::std::__cxx11::string::string(local_5a0,"HALF_MIN_EXP",&local_1096);
      ::std::__cxx11::string::string(local_580,"HALF_RADIX",&local_1097);
      ::std::__cxx11::string::string(local_560,"HALF_MAX",&local_1098);
      ::std::__cxx11::string::string(local_540,"HALF_MIN",&local_1099);
      ::std::__cxx11::string::string(local_520,"HALF_EPSILON",&local_109a);
      ::std::__cxx11::string::string(local_500,"MAXHALF",&local_109b);
      ::std::__cxx11::string::string(local_4e0,"HUGE_VALH",&local_109c);
      ::std::__cxx11::string::string(local_4c0,"M_E_H",&local_109d);
      ::std::__cxx11::string::string(local_4a0,"M_LOG2E_H",&local_109e);
      ::std::__cxx11::string::string(local_480,"M_LOG10E_H",&local_109f);
      ::std::__cxx11::string::string(local_460,"M_LN2_H",&local_10a0);
      ::std::__cxx11::string::string(local_440,"M_LN10_H",&local_10a1);
      ::std::__cxx11::string::string(local_420,"M_PI_H",&local_10a2);
      ::std::__cxx11::string::string(local_400,"M_PI_2_H",&local_10a3);
      ::std::__cxx11::string::string(local_3e0,"M_PI_4_H",&local_10a4);
      ::std::__cxx11::string::string(local_3c0,"M_1_PI_H",&local_10a5);
      ::std::__cxx11::string::string(local_3a0,"M_2_PI_H",&local_10a6);
      ::std::__cxx11::string::string(local_380,"M_2_SQRTPI_H",&local_10a7);
      ::std::__cxx11::string::string(local_360,"M_SQRT2_H",&local_10a8);
      ::std::__cxx11::string::string(local_340,"M_SQRT1_2_H",&local_10a9);
      ::std::__cxx11::string::string(local_320,"DBL_DIG",&local_10aa);
      ::std::__cxx11::string::string(local_300,"DBL_MANT_DIG",&local_10ab);
      ::std::__cxx11::string::string(local_2e0,"DBL_MAX_10_EXP",&local_10ac);
      ::std::__cxx11::string::string(local_2c0,"DBL_MAX_EXP",&local_10ad);
      ::std::__cxx11::string::string(local_2a0,"DBL_MIN_10_EXP",&local_10ae);
      ::std::__cxx11::string::string(local_280,"DBL_MIN_EXP",&local_10af);
      ::std::__cxx11::string::string(local_260,"DBL_RADIX",&local_10b0);
      ::std::__cxx11::string::string(local_240,"DBL_MAX",&local_10b1);
      ::std::__cxx11::string::string(local_220,"DBL_MIN",&local_10b2);
      ::std::__cxx11::string::string(local_200,"DBL_EPSILON",&local_10b3);
      ::std::__cxx11::string::string(local_1e0,"HUGE_VAL",&local_10b4);
      ::std::__cxx11::string::string(local_1c0,"M_E",&local_10b5);
      ::std::__cxx11::string::string(local_1a0,"M_LOG2E",&local_10b6);
      ::std::__cxx11::string::string(local_180,"M_LOG10E",&local_10b7);
      ::std::__cxx11::string::string(local_160,"M_LN2",&local_10b8);
      ::std::__cxx11::string::string(local_140,"M_LN10",&local_10b9);
      ::std::__cxx11::string::string(local_120,"M_PI",&local_10ba);
      ::std::__cxx11::string::string(local_100,"M_PI_2",&local_10bb);
      ::std::__cxx11::string::string(local_e0,"M_PI_4",&local_10bc);
      ::std::__cxx11::string::string(local_c0,"M_1_PI",&local_10bd);
      ::std::__cxx11::string::string(local_a0,"M_2_PI",&local_10be);
      ::std::__cxx11::string::string(local_80,"M_2_SQRTPI",&local_10bf);
      ::std::__cxx11::string::string(local_60,"M_SQRT2",&local_10c0);
      ::std::__cxx11::string::string(local_40,"M_SQRT1_2",&local_10c1);
      ::std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,local_1040,
                 &stack0xffffffffffffffe0,0,&local_10c2,&local_10c3,&local_10c4);
      lVar2 = 0x1000;
      do {
        ::std::__cxx11::string::~string(local_1040 + lVar2);
        lVar2 = lVar2 + -0x20;
      } while (lVar2 != -0x20);
      __cxa_atexit(::std::
                   unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~unordered_set,
                   &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_,&__dso_handle
                  );
      __cxa_guard_release(&get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_);
    }
  }
  return &get_illegal_func_names[abi:cxx11]()::illegal_func_names_abi_cxx11_;
}

Assistant:

const std::unordered_set<std::string> &CompilerMSL::get_illegal_func_names()
{
	static const unordered_set<string> illegal_func_names = {
		"main",
		"fragment",
		"vertex",
		"kernel",
		"saturate",
		"assert",
		"fmin3",
		"fmax3",
		"divide",
		"fmod",
		"median3",
		"VARIABLE_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT",
		"STATIC_DATA_TRACEPOINT_V",
		"METAL_ALIGN",
		"METAL_ASM",
		"METAL_CONST",
		"METAL_DEPRECATED",
		"METAL_ENABLE_IF",
		"METAL_FUNC",
		"METAL_INTERNAL",
		"METAL_NON_NULL_RETURN",
		"METAL_NORETURN",
		"METAL_NOTHROW",
		"METAL_PURE",
		"METAL_UNAVAILABLE",
		"METAL_IMPLICIT",
		"METAL_EXPLICIT",
		"METAL_CONST_ARG",
		"METAL_ARG_UNIFORM",
		"METAL_ZERO_ARG",
		"METAL_VALID_LOD_ARG",
		"METAL_VALID_LEVEL_ARG",
		"METAL_VALID_STORE_ORDER",
		"METAL_VALID_LOAD_ORDER",
		"METAL_VALID_COMPARE_EXCHANGE_FAILURE_ORDER",
		"METAL_COMPATIBLE_COMPARE_EXCHANGE_ORDERS",
		"METAL_VALID_RENDER_TARGET",
		"is_function_constant_defined",
		"CHAR_BIT",
		"SCHAR_MAX",
		"SCHAR_MIN",
		"UCHAR_MAX",
		"CHAR_MAX",
		"CHAR_MIN",
		"USHRT_MAX",
		"SHRT_MAX",
		"SHRT_MIN",
		"UINT_MAX",
		"INT_MAX",
		"INT_MIN",
		"FLT_DIG",
		"FLT_MANT_DIG",
		"FLT_MAX_10_EXP",
		"FLT_MAX_EXP",
		"FLT_MIN_10_EXP",
		"FLT_MIN_EXP",
		"FLT_RADIX",
		"FLT_MAX",
		"FLT_MIN",
		"FLT_EPSILON",
		"FP_ILOGB0",
		"FP_ILOGBNAN",
		"MAXFLOAT",
		"HUGE_VALF",
		"INFINITY",
		"NAN",
		"M_E_F",
		"M_LOG2E_F",
		"M_LOG10E_F",
		"M_LN2_F",
		"M_LN10_F",
		"M_PI_F",
		"M_PI_2_F",
		"M_PI_4_F",
		"M_1_PI_F",
		"M_2_PI_F",
		"M_2_SQRTPI_F",
		"M_SQRT2_F",
		"M_SQRT1_2_F",
		"HALF_DIG",
		"HALF_MANT_DIG",
		"HALF_MAX_10_EXP",
		"HALF_MAX_EXP",
		"HALF_MIN_10_EXP",
		"HALF_MIN_EXP",
		"HALF_RADIX",
		"HALF_MAX",
		"HALF_MIN",
		"HALF_EPSILON",
		"MAXHALF",
		"HUGE_VALH",
		"M_E_H",
		"M_LOG2E_H",
		"M_LOG10E_H",
		"M_LN2_H",
		"M_LN10_H",
		"M_PI_H",
		"M_PI_2_H",
		"M_PI_4_H",
		"M_1_PI_H",
		"M_2_PI_H",
		"M_2_SQRTPI_H",
		"M_SQRT2_H",
		"M_SQRT1_2_H",
		"DBL_DIG",
		"DBL_MANT_DIG",
		"DBL_MAX_10_EXP",
		"DBL_MAX_EXP",
		"DBL_MIN_10_EXP",
		"DBL_MIN_EXP",
		"DBL_RADIX",
		"DBL_MAX",
		"DBL_MIN",
		"DBL_EPSILON",
		"HUGE_VAL",
		"M_E",
		"M_LOG2E",
		"M_LOG10E",
		"M_LN2",
		"M_LN10",
		"M_PI",
		"M_PI_2",
		"M_PI_4",
		"M_1_PI",
		"M_2_PI",
		"M_2_SQRTPI",
		"M_SQRT2",
		"M_SQRT1_2",
	};

	return illegal_func_names;
}